

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

BIGNUM * bn_expand2(BIGNUM *a,int words)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  ulong *pnt;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong *puVar7;
  long lVar8;
  int iVar9;
  
  if (a->dmax < words) {
    if ((words < 0x800000) && ((a->flags & 2U) == 0)) {
      if ((a->flags & 8U) == 0) {
        puVar7 = (ulong *)CRYPTO_zalloc((long)words << 3);
      }
      else {
        puVar7 = (ulong *)CRYPTO_secure_zalloc((long)words << 3);
      }
      if (puVar7 != (ulong *)0x0) {
        pnt = a->d;
        if (pnt != (ulong *)0x0) {
          uVar3 = a->top;
          lVar8 = 0x10;
          for (iVar9 = (int)uVar3 >> 2; 0 < iVar9; iVar9 = iVar9 + -1) {
            puVar1 = (undefined8 *)((long)pnt + lVar8 + -0x10);
            uVar4 = puVar1[1];
            uVar5 = *(undefined8 *)((long)pnt + lVar8);
            uVar6 = ((undefined8 *)((long)pnt + lVar8))[1];
            puVar2 = (undefined8 *)((long)puVar7 + lVar8 + -0x10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar4;
            *(undefined8 *)((long)puVar7 + lVar8) = uVar5;
            ((undefined8 *)((long)puVar7 + lVar8))[1] = uVar6;
            lVar8 = lVar8 + 0x20;
          }
          switch(uVar3 & 3) {
          case 3:
            *(undefined8 *)((long)puVar7 + lVar8) = *(undefined8 *)((long)pnt + lVar8);
          case 2:
            *(undefined8 *)((long)puVar7 + lVar8 + -8) = *(undefined8 *)((long)pnt + lVar8 + -8);
          case 1:
            *(undefined8 *)((long)puVar7 + lVar8 + -0x10) =
                 *(undefined8 *)((long)pnt + lVar8 + -0x10);
          case 0:
            CRYPTO_memzero(pnt,(long)a->dmax << 3);
            bn_free_d((BIGNUM *)a);
          }
        }
        a->d = puVar7;
        a->dmax = words;
        return a;
      }
    }
    a = (BIGNUM *)0x0;
  }
  return a;
}

Assistant:

BIGNUM *bn_expand2(BIGNUM *b, int words)
{
    bn_check_top(b);

    if (words > b->dmax) {
        BN_ULONG *a = bn_expand_internal(b, words);
        if (!a)
            return NULL;
        if (b->d) {
            CRYPTO_memzero(b->d, b->dmax * sizeof(b->d[0]));
            bn_free_d(b);
        }
        b->d = a;
        b->dmax = words;
    }

    bn_check_top(b);
    return b;
}